

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

Status leveldb::SetCurrentFile(Env *env,string *dbname,uint64_t descriptor_number)

{
  bool bVar1;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Status *s;
  Slice contents;
  string tmp;
  string manifest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  long *plVar2;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_108 [8];
  undefined1 local_100 [56];
  undefined1 local_c8 [96];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  DescriptorFileName(in_stack_fffffffffffffe90,
                     CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  Slice::Slice((Slice *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80);
  std::operator+(in_RDI,(char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  Slice::Slice((Slice *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80);
  bVar1 = Slice::starts_with((Slice *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                             (Slice *)in_stack_fffffffffffffe90);
  if (!bVar1) {
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_fffffffffffffe78);
  Slice::remove_prefix
            ((Slice *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (size_t)in_stack_fffffffffffffe80);
  TempFileName(in_stack_fffffffffffffe90,
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  Slice::ToString_abi_cxx11_((Slice *)this);
  std::operator+(in_stack_fffffffffffffe90,
                 (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  Slice::Slice((Slice *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80);
  WriteStringToFileSync
            ((Env *)in_stack_fffffffffffffe90,
             (Slice *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  bVar1 = Status::ok((Status *)in_stack_fffffffffffffe78);
  if (bVar1) {
    plVar2 = in_RSI;
    CurrentFileName(in_stack_fffffffffffffe80);
    (**(code **)(*plVar2 + 0x60))(local_100,plVar2,local_68,local_c8);
    Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                      (Status *)in_stack_fffffffffffffe80);
    Status::~Status((Status *)in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  }
  bVar1 = Status::ok((Status *)in_stack_fffffffffffffe78);
  if (!bVar1) {
    (**(code **)(*in_RSI + 0x40))(local_108,in_RSI,local_68);
    Status::~Status((Status *)in_stack_fffffffffffffe78);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}